

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O3

void __thiscall
solitaire::SolitaireTest_getTableauPile_Test::TestBody(SolitaireTest_getTableauPile_Test *this)

{
  char *message;
  AssertHelper local_30;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  PileId local_c;
  
  local_c.t = (anonymous_namespace)::lastTableauPileId;
  local_28._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Solitaire::getTableauPile(&(this->super_SolitaireTest).solitaire,&local_c);
  local_30.data_ = (AssertHelperData *)(this->super_SolitaireTest).lastTableauPileMock;
  testing::internal::
  CmpHelperEQ<solitaire::piles::interfaces::TableauPile_const*,solitaire::piles::TableauPileMock*>
            (local_20,"&solitaire.getTableauPile(lastTableauPileId)","&lastTableauPileMock",
             (TableauPile **)&local_28,(TableauPileMock **)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x9c,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(*(_func_int ***)local_28._M_head_impl)[1])();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  return;
}

Assistant:

TEST_F(SolitaireTest, getTableauPile) {
    EXPECT_EQ(&solitaire.getTableauPile(lastTableauPileId), &lastTableauPileMock);
}